

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O0

TPZSYsmpMatrix<std::complex<long_double>_> * __thiscall
TPZSYsmpMatrix<std::complex<long_double>_>::operator-
          (TPZSYsmpMatrix<std::complex<long_double>_> *this,
          TPZSYsmpMatrix<std::complex<long_double>_> *mat)

{
  int64_t iVar1;
  complex<long_double> *this_00;
  complex<long_double> *__z;
  long in_RDX;
  long *in_RSI;
  TPZSYsmpMatrix<std::complex<long_double>_> *in_RDI;
  int i;
  int64_t sizeA;
  TPZSYsmpMatrix<std::complex<long_double>_> *res;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  TPZSYsmpMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd0;
  
  (**(code **)(*in_RSI + 0x250))(in_RSI,in_RSI,in_RDX);
  TPZSYsmpMatrix(in_stack_ffffffffffffffd0,
                 (TPZSYsmpMatrix<std::complex<long_double>_> *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = TPZVec<std::complex<long_double>_>::size(&in_RDI->fA);
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    this_00 = TPZVec<std::complex<long_double>_>::operator[]
                        ((TPZVec<std::complex<long_double>_> *)(in_RDX + 0x60),(long)iVar2);
    __z = TPZVec<std::complex<long_double>_>::operator[](&in_RDI->fA,(long)iVar2);
    std::complex<long_double>::operator-=(this_00,__z);
  }
  return in_RDI;
}

Assistant:

TPZSYsmpMatrix<TVar> TPZSYsmpMatrix<TVar>::operator-(const TPZSYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] -= mat.fA[i];
	return res;
}